

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O0

SignatureData *
transaction_tests::CombineSignatures
          (CMutableTransaction *input1,CMutableTransaction *input2,CTransactionRef *tx)

{
  CAmount *in_RDX;
  vector<CTxOut,_std::allocator<CTxOut>_> *in_RSI;
  SignatureData *in_RDI;
  long in_FS_OFFSET;
  SignatureData *sigdata;
  SignatureData *in_stack_fffffffffffff7f8;
  SignatureData *in_stack_fffffffffffff800;
  SigningProvider *__n;
  SignatureData *in_stack_fffffffffffff808;
  int hash_type;
  uint input_idx;
  SignatureData *this;
  SignatureData *in_stack_fffffffffffff888;
  CTxOut *in_stack_fffffffffffff8d0;
  uint in_stack_fffffffffffff8dc;
  CMutableTransaction *in_stack_fffffffffffff8e0;
  SignatureData *in_stack_fffffffffffff910;
  CScript *in_stack_fffffffffffff918;
  BaseSignatureCreator *in_stack_fffffffffffff920;
  SigningProvider *in_stack_fffffffffffff928;
  undefined1 local_398 [912];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  SignatureData::SignatureData(in_stack_fffffffffffff888);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffff7f8);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff808,
             (size_type)in_stack_fffffffffffff800);
  DataFromTransaction(in_stack_fffffffffffff8e0,in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d0)
  ;
  hash_type = (int)((ulong)local_398 >> 0x20);
  SignatureData::operator=(in_stack_fffffffffffff808,in_stack_fffffffffffff800);
  SignatureData::~SignatureData(in_stack_fffffffffffff7f8);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffff7f8);
  input_idx = 0;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff808,
             (size_type)in_stack_fffffffffffff800);
  DataFromTransaction(in_stack_fffffffffffff8e0,in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d0)
  ;
  SignatureData::MergeSignatureData(this,in_RDI);
  SignatureData::~SignatureData(in_stack_fffffffffffff7f8);
  __n = DUMMY_SIGNING_PROVIDER;
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffff7f8);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[](in_RSI,(size_type)__n);
  MutableTransactionSignatureCreator::MutableTransactionSignatureCreator
            ((MutableTransactionSignatureCreator *)this,(CMutableTransaction *)in_RDI,input_idx,
             in_RDX,hash_type);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffff7f8);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[](in_RSI,(size_type)__n);
  ProduceSignature(in_stack_fffffffffffff928,in_stack_fffffffffffff920,in_stack_fffffffffffff918,
                   in_stack_fffffffffffff910);
  MutableTransactionSignatureCreator::~MutableTransactionSignatureCreator
            ((MutableTransactionSignatureCreator *)in_stack_fffffffffffff7f8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

SignatureData CombineSignatures(const CMutableTransaction& input1, const CMutableTransaction& input2, const CTransactionRef tx)
{
    SignatureData sigdata;
    sigdata = DataFromTransaction(input1, 0, tx->vout[0]);
    sigdata.MergeSignatureData(DataFromTransaction(input2, 0, tx->vout[0]));
    ProduceSignature(DUMMY_SIGNING_PROVIDER, MutableTransactionSignatureCreator(input1, 0, tx->vout[0].nValue, SIGHASH_ALL), tx->vout[0].scriptPubKey, sigdata);
    return sigdata;
}